

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedStringView::GenerateAccessorDeclarations
          (RepeatedStringView *this,Printer *p)

{
  CType CVar1;
  FieldDescriptor *field;
  CType CVar2;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_98;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  undefined8 local_30;
  char *local_28;
  
  field = (this->super_FieldGeneratorBase).field_;
  CVar1 = *(CType *)(*(long *)(field + 0x38) + 0x80);
  CVar2 = protobuf::internal::cpp::
          EffectiveStringCType<google::protobuf::FieldDescriptor,google::protobuf::FieldOptions>
                    (field);
  if (CVar1 != CVar2) {
    io::Printer::Emit(p,0x3c,"\n      private:  // Hidden due to unknown ctype option.\n    ");
  }
  v3.storage_.callback_buffer_[8] = '\n';
  v3.storage_.callback_buffer_[9] = '\0';
  v3.storage_.callback_buffer_[10] = '\0';
  v3.storage_.callback_buffer_[0xb] = '\0';
  v3.storage_.callback_buffer_[0xc] = '\0';
  v3.storage_.callback_buffer_[0xd] = '\0';
  v3.storage_.callback_buffer_[0xe] = '\0';
  v3.storage_.callback_buffer_[0xf] = '\0';
  v3.storage_.is_callback_engaged_ = false;
  v3.storage_._1_7_ = 0;
  v3.storage_.callback_buffer_._0_8_ = (long)" \t" + 2;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)&v2,(cpp *)(this->super_FieldGeneratorBase).field_,(FieldDescriptor *)&v3,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(2),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars.len_ = (long)(v2.storage_.callback_buffer_._0_8_ - v2.storage_._0_8_) / 0xb8;
  vars.ptr_ = (pointer)v2.storage_._0_8_;
  io::Printer::WithVars(&v1,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&v2);
  v3.storage_.callback_buffer_[8] = '\x04';
  v3.storage_.callback_buffer_[9] = '\0';
  v3.storage_.callback_buffer_[10] = '\0';
  v3.storage_.callback_buffer_[0xb] = '\0';
  v3.storage_.callback_buffer_[0xc] = '\0';
  v3.storage_.callback_buffer_[0xd] = '\0';
  v3.storage_.callback_buffer_[0xe] = '\0';
  v3.storage_.callback_buffer_[0xf] = '\0';
  v3.storage_.is_callback_engaged_ = true;
  v3.storage_._1_7_ = 0;
  v3.storage_.callback_buffer_._0_8_ = (long)"_internal_set_" + 10;
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x2;
  AnnotatedAccessors(&local_98,(cpp *)(this->super_FieldGeneratorBase).field_,(FieldDescriptor *)&v3
                     ,prefixes,(optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9)
  ;
  vars_00.len_ = ((long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xb8;
  vars_00.ptr_ = local_98.
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithVars(&v2,p,vars_00);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_98);
  local_30 = 8;
  local_28 = "mutable_";
  prefixes_00.len_ = 0x100000002;
  prefixes_00.ptr_ = (pointer)0x1;
  AnnotatedAccessors(&local_98,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)&local_30,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_01.len_ = ((long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xb8;
  vars_01.ptr_ = local_98.
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithVars(&v3,p,vars_01);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_98);
  io::Printer::Emit(p,0x36e,
                    "\n    $DEPRECATED$ absl::string_view $name$(int index) const;\n    $DEPRECATED$ void $set_name$(int index, const std::string& value);\n    $DEPRECATED$ void $set_name$(int index, std::string&& value);\n    $DEPRECATED$ void $set_name$(int index, const char* value);\n    $DEPRECATED$ void $set_name$(int index, absl::string_view value);\n    $DEPRECATED$ void $add_name$(const std::string& value);\n    $DEPRECATED$ void $add_name$(std::string&& value);\n    $DEPRECATED$ void $add_name$(const char* value);\n    $DEPRECATED$ void $add_name$(absl::string_view value);\n    $DEPRECATED$ const $pb$::RepeatedPtrField<std::string>& $name$() const;\n    $DEPRECATED$ $pb$::RepeatedPtrField<std::string>* $mutable_name$();\n\n    private:\n    const $pb$::RepeatedPtrField<std::string>& _internal_$name$() const;\n    $pb$::RepeatedPtrField<std::string>* _internal_mutable_$name$();\n\n    public:\n  "
                   );
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v3);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v2);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v1);
  return;
}

Assistant:

void RepeatedStringView::GenerateAccessorDeclarations(io::Printer* p) const {
  bool unknown_ctype =
      field_->options().ctype() != internal::cpp::EffectiveStringCType(field_);

  if (unknown_ctype) {
    p->Emit(R"cc(
      private:  // Hidden due to unknown ctype option.
    )cc");
  }

  auto v1 = p->WithVars(AnnotatedAccessors(field_, {"", "_internal_"}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_", "add_"}, AnnotationCollector::kSet));
  auto v3 = p->WithVars(
      AnnotatedAccessors(field_, {"mutable_"}, AnnotationCollector::kAlias));

  p->Emit(R"cc(
    $DEPRECATED$ absl::string_view $name$(int index) const;
    $DEPRECATED$ void $set_name$(int index, const std::string& value);
    $DEPRECATED$ void $set_name$(int index, std::string&& value);
    $DEPRECATED$ void $set_name$(int index, const char* value);
    $DEPRECATED$ void $set_name$(int index, absl::string_view value);
    $DEPRECATED$ void $add_name$(const std::string& value);
    $DEPRECATED$ void $add_name$(std::string&& value);
    $DEPRECATED$ void $add_name$(const char* value);
    $DEPRECATED$ void $add_name$(absl::string_view value);
    $DEPRECATED$ const $pb$::RepeatedPtrField<std::string>& $name$() const;
    $DEPRECATED$ $pb$::RepeatedPtrField<std::string>* $mutable_name$();

    private:
    const $pb$::RepeatedPtrField<std::string>& _internal_$name$() const;
    $pb$::RepeatedPtrField<std::string>* _internal_mutable_$name$();

    public:
  )cc");
}